

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O0

uint64_t aom_mse_wxh_16bit_sse2(uint8_t *dst,int dstride,uint16_t *src,int sstride,int w,int h)

{
  int in_R8D;
  int in_stack_00000080;
  int in_stack_00000084;
  uint16_t *in_stack_00000088;
  int in_stack_00000094;
  uint8_t *in_stack_00000098;
  int in_stack_000000b0;
  int in_stack_000000b4;
  uint16_t *in_stack_000000b8;
  int in_stack_000000c4;
  uint8_t *in_stack_000000c8;
  undefined8 local_8;
  
  if (in_R8D == 4) {
    local_8 = mse_4xh_16bit_sse2(in_stack_000000c8,in_stack_000000c4,in_stack_000000b8,
                                 in_stack_000000b4,in_stack_000000b0);
  }
  else if (in_R8D == 8) {
    local_8 = mse_8xh_16bit_sse2(in_stack_00000098,in_stack_00000094,in_stack_00000088,
                                 in_stack_00000084,in_stack_00000080);
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

uint64_t aom_mse_wxh_16bit_sse2(uint8_t *dst, int dstride, uint16_t *src,
                                int sstride, int w, int h) {
  assert((w == 8 || w == 4) && (h == 8 || h == 4) &&
         "w=8/4 and h=8/4 must satisfy");
  switch (w) {
    case 4: return mse_4xh_16bit_sse2(dst, dstride, src, sstride, h);
    case 8: return mse_8xh_16bit_sse2(dst, dstride, src, sstride, h);
    default: assert(0 && "unsupported width"); return -1;
  }
}